

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepImage.cpp
# Opt level: O3

void anon_unknown.dwarf_22b6e::testSetSampleCounts(Box2i *dataWindow)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  float *pfVar2;
  float fVar3;
  int iVar4;
  uint uVar5;
  double dVar6;
  Box2i *pBVar7;
  ostream *poVar8;
  TypedDeepImageChannel<float> *pTVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  Rand48 random;
  float oldSamples [20];
  DeepImage img;
  ushort local_10e [3];
  DeepImageLevel *local_108;
  DeepImageLevel *local_100;
  Box2i *local_f8;
  ulong local_f0;
  string local_e8 [2];
  DeepImage local_98 [104];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"change sample counts, data window = (",0x25);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(dataWindow->min).x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(dataWindow->min).y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,") - (",5);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(dataWindow->max).x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(dataWindow->max).y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  Imf_3_2::DeepImage::DeepImage(local_98);
  Imf_3_2::Image::resize((Box *)local_98,(LevelMode)dataWindow,ROUND_DOWN);
  paVar1 = &local_e8[0].field_2;
  local_e8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"F","");
  Imf_3_2::Image::insertChannel((string *)local_98,(PixelType)local_e8,2,1,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8[0]._M_dataplus._M_p,local_e8[0].field_2._M_allocated_capacity + 1);
  }
  local_10e[0] = 0x5a5a;
  local_10e[1] = 0x5a5a;
  local_10e[2] = 0x5a5a;
  local_108 = (DeepImageLevel *)Imf_3_2::DeepImage::level((int)local_98);
  local_e8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"F","");
  pTVar9 = Imf_3_2::DeepImageLevel::typedChannel<float>(local_108,local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8[0]._M_dataplus._M_p,local_e8[0].field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(pTVar9 + 0x28) != 0) {
    local_100 = local_108 + 0x58;
    uVar13 = 0;
    local_f8 = dataWindow;
    do {
      pBVar7 = local_f8;
      iVar15 = (local_f8->min).x;
      local_f0 = uVar13;
      lVar10 = Imath_3_2::nrand48(local_10e);
      iVar12 = *(int *)(pTVar9 + 0x1c);
      iVar4 = (pBVar7->min).y;
      lVar11 = Imath_3_2::nrand48(local_10e);
      iVar15 = iVar15 + (int)(lVar10 % (long)iVar12);
      uVar14 = iVar4 + (int)(lVar11 % (long)*(int *)(pTVar9 + 0x20));
      Imf_3_2::ImageChannel::boundsCheck((int)local_100,iVar15);
      uVar5 = *(uint *)(*(long *)(local_108 + 0x90) +
                       (long)(int)(*(int *)(local_108 + 0x74) * uVar14 + iVar15) * 4);
      lVar10 = Imath_3_2::nrand48(local_10e);
      if (0 < (int)uVar5) {
        memcpy(local_e8,*(void **)(*(long *)(pTVar9 + 0x38) +
                                  (long)(int)(*(int *)(pTVar9 + 0x1c) * uVar14 + iVar15) * 8),
               (ulong)uVar5 * 4);
      }
      lVar10 = lVar10 + (lVar10 / 0x15) * -0x15 + (lVar10 / -0x5800000000000000) * 0x15;
      Imf_3_2::SampleCountChannel::set((int)local_100,iVar15,uVar14);
      if ((int)uVar5 < (int)lVar10) {
        if (0 < (int)uVar5) {
          uVar13 = 0;
          do {
            fVar3 = *(float *)(*(long *)(*(long *)(pTVar9 + 0x38) +
                                        (long)(int)(*(int *)(pTVar9 + 0x1c) * uVar14 + iVar15) * 8)
                              + uVar13 * 4);
            pfVar2 = (float *)((long)&local_e8[0]._M_dataplus._M_p + uVar13 * 4);
            if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
              __assert_fail("channel (x, y)[j] == oldSamples[j]",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                            ,0x1ad,"void (anonymous namespace)::testSetSampleCounts(const Box2i &)")
              ;
            }
            uVar13 = uVar13 + 1;
          } while (uVar5 != uVar13);
        }
        lVar16 = (long)(int)uVar5;
        lVar11 = *(long *)(pTVar9 + 0x38);
        iVar12 = *(int *)(pTVar9 + 0x1c);
        do {
          fVar3 = *(float *)(*(long *)(lVar11 + (long)(int)(iVar12 * uVar14 + iVar15) * 8) +
                            lVar16 * 4);
          if ((fVar3 != 0.0) || (NAN(fVar3))) {
            __assert_fail("channel (x, y)[j] == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                          ,0x1b1,"void (anonymous namespace)::testSetSampleCounts(const Box2i &)");
          }
          dVar6 = (double)Imath_3_2::erand48(local_10e);
          lVar11 = *(long *)(pTVar9 + 0x38);
          iVar12 = *(int *)(pTVar9 + 0x1c);
          *(float *)(*(long *)(lVar11 + (long)(int)(iVar12 * uVar14 + iVar15) * 8) + lVar16 * 4) =
               (float)dVar6;
          lVar16 = lVar16 + 1;
        } while (lVar10 != lVar16);
      }
      else if (0 < lVar10) {
        lVar11 = 0;
        do {
          fVar3 = *(float *)(*(long *)(*(long *)(pTVar9 + 0x38) +
                                      (long)(int)(uVar14 * *(int *)(pTVar9 + 0x1c) + iVar15) * 8) +
                            lVar11 * 4);
          pfVar2 = (float *)((long)&local_e8[0]._M_dataplus._M_p + lVar11 * 4);
          if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
            __assert_fail("channel (x, y)[j] == oldSamples[j]",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                          ,0x1b8,"void (anonymous namespace)::testSetSampleCounts(const Box2i &)");
          }
          lVar11 = lVar11 + 1;
        } while (lVar10 != lVar11);
      }
      uVar13 = local_f0 + 1;
    } while (uVar13 < *(ulong *)(pTVar9 + 0x28));
  }
  Imf_3_2::DeepImage::~DeepImage(local_98);
  return;
}

Assistant:

void
testSetSampleCounts (const Box2i& dataWindow)
{
    cout << "change sample counts, data window = "
            "("
         << dataWindow.min.x << ", " << dataWindow.min.y
         << ") - "
            "("
         << dataWindow.max.x << ", " << dataWindow.max.y << ")" << endl;

    DeepImage img;
    img.resize (dataWindow, ONE_LEVEL, ROUND_DOWN);
    img.insertChannel ("F", FLOAT, 1, 1, false);

    Rand48 random (0);

    DeepImageLevel&     level        = img.level ();
    DeepFloatChannel&   channel      = level.typedChannel<float> ("F");
    SampleCountChannel& sampleCounts = level.sampleCounts ();

    const int MAX_SAMPLES = 20;

    for (size_t i = 0; i < channel.numPixels (); ++i)
    {
        int x = dataWindow.min.x + random.nexti () % channel.pixelsPerRow ();
        int y = dataWindow.min.y + random.nexti () % channel.pixelsPerColumn ();

        int oldN = sampleCounts.at (x, y);
        int newN = random.nexti () % (MAX_SAMPLES + 1);

        float oldSamples[MAX_SAMPLES];

        for (int j = 0; j < oldN; ++j)
            oldSamples[j] = channel (x, y)[j];

        sampleCounts.set (x, y, newN);

        if (newN > oldN)
        {
            for (int j = 0; j < oldN; ++j)
                assert (channel (x, y)[j] == oldSamples[j]);

            for (int j = oldN; j < newN; ++j)
            {
                assert (channel (x, y)[j] == 0);
                channel (x, y)[j] = random.nextf ();
            }
        }
        else
        {
            for (int j = 0; j < newN; ++j)
                assert (channel (x, y)[j] == oldSamples[j]);
        }
    }
}